

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibraryinfo.cpp
# Opt level: O0

QString * QLibraryInfoPrivate::path(LibraryPath p,UsageMode usageMode)

{
  QString *in_RDI;
  long in_FS_OFFSET;
  UsageMode in_stack_000000b0;
  LibraryPath in_stack_000000b4;
  QString *defaultValue;
  undefined1 *i;
  QList<QString> *in_stack_ffffffffffffffa8;
  undefined1 local_38 [24];
  QString local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  defaultValue = &local_20;
  paths(in_stack_000000b4,in_stack_000000b0);
  i = local_38;
  QString::QString((QString *)0x238f1c);
  QList<QString>::value(in_stack_ffffffffffffffa8,(qsizetype)i,defaultValue);
  QString::~QString((QString *)0x238f40);
  QList<QString>::~QList((QList<QString> *)0x238f4a);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QLibraryInfoPrivate::path(QLibraryInfo::LibraryPath p, UsageMode usageMode)
{
    return paths(p, usageMode).value(0, QString());
}